

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O1

int psa_generic_status_to_mbedtls(psa_status_t status)

{
  if (status < -0x91) {
    if (status == -0x97) {
      return -0x6e;
    }
    if (status == -0x93) {
      return -0x70;
    }
  }
  else {
    if (status == -0x91) {
      return -0x70;
    }
    if (status == 0) {
      return 0;
    }
    if (status == -0x86) {
      return -0x72;
    }
  }
  return -1;
}

Assistant:

int psa_generic_status_to_mbedtls(psa_status_t status)
{
    switch (status) {
        case PSA_SUCCESS:
            return 0;
        case PSA_ERROR_NOT_SUPPORTED:
            return MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED;
        case PSA_ERROR_CORRUPTION_DETECTED:
            return MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        case PSA_ERROR_COMMUNICATION_FAILURE:
        case PSA_ERROR_HARDWARE_FAILURE:
            return MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED;
        case PSA_ERROR_NOT_PERMITTED:
        default:
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
    }
}